

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O3

void __thiscall
chrono::ChFile_ps::ChFile_ps
          (ChFile_ps *this,char *m_name,double x,double y,double w,double h,char *m_prolog_file)

{
  ChStreamOutAscii *pCVar1;
  ChStreamOutAscii *pCVar2;
  char mch;
  ChStreamInAsciiFile mprolog;
  char local_351;
  double local_350;
  double local_348;
  double local_340;
  double local_338;
  ChStreamInAsciiFile local_310;
  
  local_350 = h;
  local_348 = w;
  local_340 = y;
  local_338 = x;
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&this->super_ChStreamOutAsciiFile,m_name,_S_trunc);
  pCVar2 = &(this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii;
  (this->super_ChStreamOutAsciiFile).super_ChStreamFile._vptr_ChStreamFile =
       (_func_int **)&PTR__ChFile_ps_00b026c0;
  (this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii.super_ChStreamOut._vptr_ChStreamOut =
       (_func_int **)&DAT_00b02708;
  (this->page_size).m_data[0] = 0.0;
  (this->page_size).m_data[1] = 0.0;
  (this->G_p).m_data[0] = 0.0;
  (this->G_p).m_data[1] = 0.0;
  (this->Gs_p).m_data[0] = 0.0;
  (this->Gs_p).m_data[1] = 0.0;
  (this->Gc_g).m_data[0] = 0.0;
  (this->Gc_g).m_data[1] = 0.0;
  (this->G_p).m_data[0] = 0.0;
  (this->G_p).m_data[1] = 0.0;
  (this->Gs_p).m_data[0] = 0.0;
  (this->Gs_p).m_data[1] = 0.0;
  (this->Gc_g).m_data[0] = 0.0;
  (this->Gc_g).m_data[1] = 0.0;
  (this->Gz).m_data[0] = 0.0;
  (this->Gz).m_data[1] = 0.0;
  (this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii.number_format[0] = '%';
  (this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii.number_format[1] = 'g';
  (this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii.number_format[2] = '\0';
  strncpy(this->prolog_file,m_prolog_file,0x95);
  this->unit_scale = 28.3476;
  (this->page_size).m_data[0] = local_348;
  (this->page_size).m_data[1] = local_350;
  (this->G_p).m_data[0] = 3.0;
  (this->G_p).m_data[1] = 3.0;
  (this->Gs_p).m_data[0] = 16.0;
  (this->Gs_p).m_data[1] = 16.0;
  (this->Gc_g).m_data[0] = 0.0;
  (this->Gc_g).m_data[1] = 0.0;
  (this->Gz).m_data[0] = 1.0;
  (this->Gz).m_data[1] = 1.0;
  ChStreamOutAscii::operator<<(pCVar2,"%%!PS-Adobe-2.0\n");
  ChStreamOutAscii::operator<<(pCVar2,"%%%%BoundingBox: ");
  pCVar1 = ChStreamOutAscii::operator<<(pCVar2,(int)(local_338 * this->unit_scale));
  ChStreamOutAscii::operator<<(pCVar1," ");
  pCVar1 = ChStreamOutAscii::operator<<(pCVar2,(int)(local_340 * this->unit_scale));
  ChStreamOutAscii::operator<<(pCVar1," ");
  local_348 = local_348 + local_338;
  pCVar1 = ChStreamOutAscii::operator<<(pCVar2,(int)(local_348 * this->unit_scale));
  ChStreamOutAscii::operator<<(pCVar1," ");
  local_350 = local_350 + local_340;
  pCVar1 = ChStreamOutAscii::operator<<(pCVar2,(int)(local_350 * this->unit_scale));
  ChStreamOutAscii::operator<<(pCVar1,"\n");
  ChStreamOutAscii::operator<<(pCVar2,"%%%%HiResBoundingBox: ");
  pCVar1 = ChStreamOutAscii::operator<<(pCVar2,local_338 * this->unit_scale);
  ChStreamOutAscii::operator<<(pCVar1," ");
  pCVar1 = ChStreamOutAscii::operator<<(pCVar2,local_340 * this->unit_scale);
  ChStreamOutAscii::operator<<(pCVar1," ");
  pCVar1 = ChStreamOutAscii::operator<<(pCVar2,local_348 * this->unit_scale);
  ChStreamOutAscii::operator<<(pCVar1," ");
  pCVar1 = ChStreamOutAscii::operator<<(pCVar2,local_350 * this->unit_scale);
  ChStreamOutAscii::operator<<(pCVar1,"\n");
  ChStreamInAsciiFile::ChStreamInAsciiFile(&local_310,this->prolog_file);
  if (((&local_310.super_ChStreamFile.field_0x28)
       [*(long *)(local_310.super_ChStreamFile._8_8_ + -0x18)] & 2) == 0) {
    do {
      ChStreamInAscii::operator>>(&local_310.super_ChStreamInAscii,&local_351);
      ChStreamOutAscii::operator<<(pCVar2,local_351);
    } while (((&local_310.super_ChStreamFile.field_0x28)
              [*(long *)(local_310.super_ChStreamFile._8_8_ + -0x18)] & 2) == 0);
  }
  ChStreamInAsciiFile::~ChStreamInAsciiFile(&local_310);
  ChStreamOutAscii::operator<<
            (pCVar2,
             "mark \n%%Page: ? 1 \n%%PageBoundingBox: 36 36 574 755 \n%%PageOrientation: Portrait \nS GS \n"
            );
  pCVar1 = ChStreamOutAscii::operator<<(pCVar2,this->unit_scale);
  pCVar1 = ChStreamOutAscii::operator<<(pCVar1," ");
  pCVar1 = ChStreamOutAscii::operator<<(pCVar1,this->unit_scale);
  ChStreamOutAscii::operator<<(pCVar1," SC\n");
  pCVar1 = ChStreamOutAscii::operator<<(pCVar2,0.01);
  ChStreamOutAscii::operator<<(pCVar1," LW\n");
  pCVar2 = ChStreamOutAscii::operator<<(pCVar2,0.0);
  ChStreamOutAscii::operator<<(pCVar2," SG\n");
  SetFont(this,"/Times-Roman",1.0);
  return;
}

Assistant:

ChFile_ps::ChFile_ps(char m_name[], double x, double y, double w, double h, char* m_prolog_file)
    : ChStreamOutAsciiFile(m_name) {
    this->SetNumFormat("%g");

    strncpy(prolog_file, m_prolog_file, sizeof(prolog_file)-1);

    // init vars..
    unit_scale = PS_SCALE_CENTIMETERS;
    page_size.x() = w;
    page_size.y() = h;
    G_p.x() = 3;
    G_p.y() = 3;
    Gs_p.x() = 16;
    Gs_p.y() = 16;
    Gc_g.x() = 0;
    Gc_g.y() = 0;
    Gz.x() = 1;
    Gz.y() = 1;

    // Write header and bounding box
    *this << "%%!PS-Adobe-2.0\n";
    *this << "%%%%BoundingBox: ";
    *this << (int)(unit_scale * x) << " ";
    *this << (int)(unit_scale * y) << " ";
    *this << (int)(unit_scale * (x + w)) << " ";
    *this << (int)(unit_scale * (y + h)) << "\n";
    *this << "%%%%HiResBoundingBox: ";
    *this << (unit_scale * x) << " ";
    *this << (unit_scale * y) << " ";
    *this << (unit_scale * (x + w)) << " ";
    *this << (unit_scale * (y + h)) << "\n";

    // Write prolog
    int copied = 0;
    try {
        ChStreamInAsciiFile mprolog(prolog_file);
        while (!mprolog.End_of_stream()) {
            char mch;
            mprolog >> mch;
            *this << mch;
            copied++;
        }
    } catch (const std::exception &) {
        if (!copied) {
            throw ChException("Could not include the 'prolog.ps'. Is the prolog.ps file properly installed?");
        }
    }

    // make first operations:
    *this << "mark \n%%Page: ? 1 \n%%PageBoundingBox: 36 36 574 755 \n%%PageOrientation: Portrait \nS GS \n";
    *this << unit_scale << " " << unit_scale << " SC\n";

    SetWidth(0.01);
    SetGray(0);
    SetFont((char*)"/Times-Roman", 1);
}